

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::console::console_func>::clear(vector<crnlib::console::console_func> *this)

{
  console_func *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (in_RDI->m_func != (console_output_func)0x0) {
    scalar_type<crnlib::console::console_func>::destruct_array(in_RDI,in_stack_ffffffffffffffec);
    crnlib_free((void *)0x11bdc6);
    in_RDI->m_func = (console_output_func)0x0;
    *(undefined4 *)&in_RDI->m_pData = 0;
    *(undefined4 *)((long)&in_RDI->m_pData + 4) = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }